

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::batch_normalize_gradient
               (double eps,tensor *gradient_input,tensor *means,tensor *invstds,tensor *src,
               tensor *gamma,tensor *src_grad,tensor *gamma_grad,tensor *beta_grad)

{
  float fVar1;
  float fVar2;
  float fVar3;
  element_type *peVar4;
  element_type *peVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar10;
  long lVar11;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ostream *poVar12;
  fatal_error *pfVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  long local_268;
  undefined1 local_240 [32];
  long lStack_220;
  long local_218;
  size_t sStack_210;
  undefined4 local_208;
  element_type *local_200;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f8;
  element_type *local_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e8;
  element_type *local_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d8;
  int local_1d0;
  any local_1c8;
  tensor *local_1c0;
  long local_1b8;
  long local_1b0;
  ostringstream dlib_o_out;
  long local_190 [4];
  undefined4 local_170;
  element_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_160;
  element_type *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_150;
  element_type *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  int local_138;
  any local_130;
  undefined4 extraout_var_01;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  
  if (src->m_n < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x339);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"src.num_samples() > 1");
    std::operator<<(poVar12,".\n");
    *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) =
         *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) | 1;
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar12,"\n");
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,(string *)local_240);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  lVar8 = src->m_nr * src->m_k * src->m_nc;
  if (lVar8 - means->m_size != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x33a);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"num == (long)means.size()");
    std::operator<<(poVar12,".\n");
    *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) =
         *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) | 1;
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar12,"\n");
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,(string *)local_240);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  if (lVar8 - invstds->m_size != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x33b);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"num == (long)invstds.size()");
    std::operator<<(poVar12,".\n");
    *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) =
         *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) | 1;
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar12,"\n");
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,(string *)local_240);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  if (lVar8 - gamma->m_size != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x33c);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"num == (long)gamma.size()");
    std::operator<<(poVar12,".\n");
    *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) =
         *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) | 1;
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar12,"\n");
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,(string *)local_240);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  if (lVar8 - gamma_grad->m_size != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x33d);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"num == (long)gamma_grad.size()");
    std::operator<<(poVar12,".\n");
    *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) =
         *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) | 1;
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar12,"\n");
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,(string *)local_240);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  if (lVar8 - beta_grad->m_size != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x33e);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"num == (long)beta_grad.size()");
    std::operator<<(poVar12,".\n");
    *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) =
         *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) | 1;
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar12,"\n");
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,(string *)local_240);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  bVar6 = have_same_dimensions(gradient_input,src);
  if (!bVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x33f);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"have_same_dimensions(gradient_input, src)");
    std::operator<<(poVar12,".\n");
    *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) =
         *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) | 1;
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar12,"\n");
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,(string *)local_240);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  bVar6 = have_same_dimensions(gradient_input,src_grad);
  if (!bVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x340);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"have_same_dimensions(gradient_input, src_grad)");
    std::operator<<(poVar12,".\n");
    *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) =
         *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) | 1;
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar12,"\n");
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,(string *)local_240);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  local_1c0 = src_grad;
  if (eps <= 0.0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x341);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"eps > 0");
    std::operator<<(poVar12,".\n");
    *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) =
         *(uint *)((long)local_190 + (long)((_func_int **)_dlib_o_out)[-3]) | 1;
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar12,"\n");
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,(string *)local_240);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  tensor::operator=(beta_grad,0.0);
  tensor::operator=(gamma_grad,0.0);
  iVar7 = (*gradient_input->_vptr_tensor[2])(gradient_input);
  lVar19 = CONCAT44(extraout_var,iVar7);
  iVar7 = (*src->_vptr_tensor[2])(src);
  local_268 = CONCAT44(extraout_var_00,iVar7);
  iVar7 = (*gamma->_vptr_tensor[2])(gamma);
  lVar9 = CONCAT44(extraout_var_01,iVar7);
  iVar7 = (*gamma_grad->_vptr_tensor[3])(gamma_grad);
  local_1b0 = CONCAT44(extraout_var_02,iVar7);
  iVar7 = (*beta_grad->_vptr_tensor[3])(beta_grad);
  local_1b8 = CONCAT44(extraout_var_03,iVar7);
  iVar7 = (*invstds->_vptr_tensor[2])(invstds);
  lVar10 = CONCAT44(extraout_var_04,iVar7);
  iVar7 = (*means->_vptr_tensor[2])(means);
  lVar11 = CONCAT44(extraout_var_05,iVar7);
  local_190[0] = 0;
  local_190[1] = 0;
  local_190[2] = 0;
  local_190[3] = 0;
  _dlib_o_out = &PTR__resizable_tensor_003316e0;
  local_170._0_1_ = true;
  local_170._1_1_ = true;
  local_170._2_1_ = false;
  local_170._3_1_ = false;
  local_168 = (element_type *)0x0;
  _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_158 = (element_type *)0x0;
  _Stack_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_138 = 0;
  local_148 = (element_type *)0x0;
  _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_130.data._M_t.super___uniq_ptr_impl<dlib::any::base,_std::default_delete<dlib::any::base>_>.
  _M_t.super__Tuple_impl<0UL,_dlib::any::base_*,_std::default_delete<dlib::any::base>_>.
  super__Head_base<0UL,_dlib::any::base_*,_false>._M_head_impl =
       (unique_ptr<dlib::any::base,_std::default_delete<dlib::any::base>_>)
       (__uniq_ptr_data<dlib::any::base,_std::default_delete<dlib::any::base>,_true,_true>)0x0;
  local_240._24_8_ = 0;
  lStack_220 = 0;
  local_240._8_8_ = 0;
  local_240._16_8_ = 0;
  local_218 = 0;
  sStack_210 = 0;
  local_240._0_8_ = &PTR__resizable_tensor_003316e0;
  local_208._0_1_ = true;
  local_208._1_1_ = true;
  local_208._2_1_ = false;
  local_208._3_1_ = false;
  local_200 = (element_type *)0x0;
  _Stack_1f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1f0 = (element_type *)0x0;
  _Stack_1e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d0 = 0;
  local_1e0 = (element_type *)0x0;
  _Stack_1d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c8.data._M_t.super___uniq_ptr_impl<dlib::any::base,_std::default_delete<dlib::any::base>_>.
  _M_t.super__Tuple_impl<0UL,_dlib::any::base_*,_std::default_delete<dlib::any::base>_>.
  super__Head_base<0UL,_dlib::any::base_*,_false>._M_head_impl =
       (unique_ptr<dlib::any::base,_std::default_delete<dlib::any::base>_>)
       (__uniq_ptr_data<dlib::any::base,_std::default_delete<dlib::any::base>,_true,_true>)0x0;
  resizable_tensor::copy_size((resizable_tensor *)&dlib_o_out,invstds);
  resizable_tensor::copy_size((resizable_tensor *)local_240,means);
  tensor::operator=((tensor *)&dlib_o_out,0.0);
  tensor::operator=((tensor *)local_240,0.0);
  peVar5 = local_168;
  peVar4 = local_200;
  lVar14 = 0;
  local_170._1_1_ = false;
  local_208._1_1_ = false;
  if (lVar8 < 1) {
    lVar8 = lVar14;
  }
  for (; lVar20 = src->m_n, lVar14 < lVar20; lVar14 = lVar14 + 1) {
    lVar15 = 0;
    lVar20 = lVar8;
    while (bVar6 = lVar20 != 0, lVar20 = lVar20 + -1, bVar6) {
      fVar22 = *(float *)(local_268 + lVar15);
      fVar1 = *(float *)(lVar11 + lVar15);
      fVar2 = *(float *)(lVar10 + lVar15);
      *(float *)(local_1b8 + lVar15) = *(float *)(lVar19 + lVar15) + *(float *)(local_1b8 + lVar15);
      *(float *)(local_1b0 + lVar15) =
           (fVar22 - fVar1) * fVar2 * *(float *)(lVar19 + lVar15) + *(float *)(local_1b0 + lVar15);
      fVar22 = *(float *)(lVar19 + lVar15);
      fVar1 = *(float *)(lVar9 + lVar15);
      fVar2 = *(float *)(local_268 + lVar15);
      fVar3 = *(float *)(lVar11 + lVar15);
      fVar21 = powf(*(float *)(lVar10 + lVar15),3.0);
      *(float *)((long)peVar5 + lVar15) =
           *(float *)((long)peVar5 + lVar15) + fVar21 * (fVar2 - fVar3) * fVar22 * fVar1 * -0.5;
      lVar15 = lVar15 + 4;
    }
    local_268 = local_268 + lVar15;
    lVar19 = lVar19 + lVar15;
  }
  iVar7 = (*gradient_input->_vptr_tensor[2])();
  lVar14 = CONCAT44(extraout_var_06,iVar7);
  iVar7 = (*src->_vptr_tensor[2])();
  lVar15 = CONCAT44(extraout_var_07,iVar7);
  fVar22 = 1.0 / (float)lVar20;
  lVar20 = 0;
  lVar19 = src->m_n;
  if (src->m_n < 1) {
    lVar19 = lVar20;
  }
  for (; lVar20 != lVar19; lVar20 = lVar20 + 1) {
    lVar16 = 0;
    for (lVar18 = 0; lVar8 != lVar18; lVar18 = lVar18 + 1) {
      peVar4[lVar18] =
           ((*(float *)(lVar15 + lVar18 * 4) - *(float *)(lVar11 + lVar18 * 4)) *
            peVar5[lVar18] * -2.0 * fVar22 -
           *(float *)(lVar14 + lVar18 * 4) * *(float *)(lVar9 + lVar18 * 4) *
           *(float *)(lVar10 + lVar18 * 4)) + peVar4[lVar18];
      lVar16 = lVar16 + -4;
    }
    lVar15 = lVar15 - lVar16;
    lVar14 = lVar14 - lVar16;
  }
  iVar7 = (*gradient_input->_vptr_tensor[2])();
  lVar14 = CONCAT44(extraout_var_08,iVar7);
  iVar7 = (*src->_vptr_tensor[2])();
  lVar20 = CONCAT44(extraout_var_09,iVar7);
  iVar7 = (*local_1c0->_vptr_tensor[3])();
  lVar15 = CONCAT44(extraout_var_10,iVar7);
  lVar16 = 0;
  lVar19 = src->m_n;
  if (src->m_n < 1) {
    lVar19 = lVar16;
  }
  for (; lVar16 != lVar19; lVar16 = lVar16 + 1) {
    lVar17 = 0;
    lVar18 = lVar8;
    while (bVar6 = lVar18 != 0, lVar18 = lVar18 + -1, bVar6) {
      *(float *)(lVar15 + lVar17) =
           *(float *)((long)peVar4 + lVar17) * fVar22 +
           *(float *)(lVar14 + lVar17) * *(float *)(lVar9 + lVar17) * *(float *)(lVar10 + lVar17) +
           (*(float *)(lVar20 + lVar17) - *(float *)(lVar11 + lVar17)) *
           (*(float *)((long)peVar5 + lVar17) + *(float *)((long)peVar5 + lVar17)) * fVar22 +
           *(float *)(lVar15 + lVar17);
      lVar17 = lVar17 + 4;
    }
    lVar20 = lVar20 + lVar17;
    lVar14 = lVar14 + lVar17;
    lVar15 = lVar15 + lVar17;
  }
  resizable_tensor::~resizable_tensor((resizable_tensor *)local_240);
  resizable_tensor::~resizable_tensor((resizable_tensor *)&dlib_o_out);
  return;
}

Assistant:

void batch_normalize_gradient (
            const double eps,
            const tensor& gradient_input,
            const tensor& means,
            const tensor& invstds,
            const tensor& src,
            const tensor& gamma,
            tensor& src_grad,
            tensor& gamma_grad, 
            tensor& beta_grad 
        )
        {

            const long num = src.k()*src.nr()*src.nc();
            DLIB_CASSERT(src.num_samples() > 1);
            DLIB_CASSERT(num == (long)means.size());
            DLIB_CASSERT(num == (long)invstds.size());
            DLIB_CASSERT(num == (long)gamma.size());
            DLIB_CASSERT(num == (long)gamma_grad.size());
            DLIB_CASSERT(num == (long)beta_grad.size());
            DLIB_CASSERT(have_same_dimensions(gradient_input, src));
            DLIB_CASSERT(have_same_dimensions(gradient_input, src_grad));
            DLIB_CASSERT(eps > 0);

            beta_grad = 0;
            gamma_grad = 0;
            auto p_grad = gradient_input.host();
            auto p_src = src.host();
            const auto p_gamma = gamma.host();   
            const auto p_gamma_grad = gamma_grad.host();   
            const auto p_beta_grad = beta_grad.host();   
            const auto p_invstds = invstds.host();
            const auto p_means = means.host();

            resizable_tensor dvars, dmeans;
            dvars.copy_size(invstds);
            dmeans.copy_size(means);
            dvars = 0;
            dmeans = 0;
            const auto p_dvars = dvars.host();
            const auto p_dmeans = dmeans.host();

            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long i = 0; i < num; ++i)
                {
                    const float x_hat = (*p_src - p_means[i])*p_invstds[i];
                    p_beta_grad[i] += *p_grad;
                    p_gamma_grad[i] += (*p_grad)*x_hat;

                    const float dx = *p_grad * p_gamma[i];

                    p_dvars[i] += dx*(*p_src - p_means[i])*-0.5*std::pow(p_invstds[i], 3.0f);

                    ++p_grad;
                    ++p_src;
                }
            }

            const float invnum = 1.0f/src.num_samples();
            p_grad = gradient_input.host();
            p_src = src.host();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long i = 0; i < num; ++i)
                {
                    const float dx = *p_grad * p_gamma[i];

                    p_dmeans[i] += dx*-p_invstds[i] + p_dvars[i] * -2*(*p_src - p_means[i])*invnum;

                    ++p_grad;
                    ++p_src;
                }
            }
            p_grad = gradient_input.host();
            p_src = src.host();
            auto p_src_grad = src_grad.host();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long i = 0; i < num; ++i)
                {
                    const float dx = *p_grad * p_gamma[i];

                    *p_src_grad += dx*p_invstds[i] + 
                        p_dvars[i] *2*(*p_src - p_means[i])*invnum + 
                        p_dmeans[i]*invnum;


                    ++p_grad;
                    ++p_src;
                    ++p_src_grad;
                }
            }
        }